

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void __thiscall
icu_63::VTimeZone::writeZonePropsByDOW_GEQ_DOM_sub
          (VTimeZone *this,VTZWriter *writer,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,
          int32_t numDays,UDate untilTime,int32_t fromOffset,UErrorCode *status)

{
  UErrorCode *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX;
  void *__buf_06;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_07;
  VTimeZone *this_00;
  int32_t i;
  int iVar1;
  UnicodeString dstr;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (dayOfMonth < 0 && month != 1) {
    dayOfMonth = dayOfMonth + *(int *)(MONTHLENGTH + (long)month * 4) + 1;
  }
  __n = status;
  beginRRULE(this,writer,month,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  VTZWriter::write(writer,0x37cbd6,__buf,(size_t)__n);
  VTZWriter::write(writer,0x3d,__buf_00,(size_t)__n);
  VTZWriter::write(writer,(dayOfWeek + -1) * 6 + 0x37cbf0,__buf_01,(size_t)__n);
  VTZWriter::write(writer,0x3b,__buf_02,(size_t)__n);
  VTZWriter::write(writer,0x37cbc0,__buf_03,(size_t)__n);
  VTZWriter::write(writer,0x3d,__buf_04,(size_t)__n);
  dstr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  dstr.fUnion.fStackFields.fLengthAndFlags = 2;
  appendAsciiDigits(dayOfMonth,'\0',&dstr);
  VTZWriter::write(writer,(int)&dstr,__buf_05,(size_t)__n);
  __buf_07 = extraout_RDX;
  for (iVar1 = 1; iVar1 < numDays; iVar1 = iVar1 + 1) {
    VTZWriter::write(writer,0x2c,__buf_07,(size_t)__n);
    __n = (UErrorCode *)(ulong)((ushort)dstr.fUnion.fStackFields.fLengthAndFlags & 0x1e);
    if ((dstr.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
      __n = (UErrorCode *)0x2;
    }
    dstr.fUnion.fStackFields.fLengthAndFlags = (int16_t)__n;
    appendAsciiDigits(dayOfMonth + iVar1,'\0',&dstr);
    VTZWriter::write(writer,(int)&dstr,__buf_06,(size_t)__n);
    __buf_07 = extraout_RDX_00;
  }
  if ((untilTime != 1.838821689216e+17) || (NAN(untilTime))) {
    this_00 = (VTimeZone *)&dstr;
    getDateTimeString((double)fromOffset + untilTime,(UnicodeString *)this_00);
    __n = status;
    appendUNTIL(this_00,writer,&dstr,status);
    __buf_07 = extraout_RDX_01;
    if (U_ZERO_ERROR < *status) goto LAB_00287ba0;
  }
  VTZWriter::write(writer,0x37cb4e,__buf_07,(size_t)__n);
LAB_00287ba0:
  icu_63::UnicodeString::~UnicodeString(&dstr);
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByDOW_GEQ_DOM_sub(VTZWriter& writer, int32_t month, int32_t dayOfMonth,
                                           int32_t dayOfWeek, int32_t numDays,
                                           UDate untilTime, int32_t fromOffset, UErrorCode& status) const {

    if (U_FAILURE(status)) {
        return;
    }
    int32_t startDayNum = dayOfMonth;
    UBool isFeb = (month == UCAL_FEBRUARY);
    if (dayOfMonth < 0 && !isFeb) {
        // Use positive number if possible
        startDayNum = MONTHLENGTH[month] + dayOfMonth + 1;
    }
    beginRRULE(writer, month, status);
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_BYDAY);
    writer.write(EQUALS_SIGN);
    writer.write(ICAL_DOW_NAMES[dayOfWeek - 1]);    // SU, MO, TU...
    writer.write(SEMICOLON);
    writer.write(ICAL_BYMONTHDAY);
    writer.write(EQUALS_SIGN);

    UnicodeString dstr;
    appendAsciiDigits(startDayNum, 0, dstr);
    writer.write(dstr);
    for (int32_t i = 1; i < numDays; i++) {
        writer.write(COMMA);
        dstr.remove();
        appendAsciiDigits(startDayNum + i, 0, dstr);
        writer.write(dstr);
    }

    if (untilTime != MAX_MILLIS) {
        appendUNTIL(writer, getDateTimeString(untilTime + fromOffset, dstr), status);
        if (U_FAILURE(status)) {
            return;
        }
    }
    writer.write(ICAL_NEWLINE);
}